

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

bool Js::SimpleTypeHandler<2UL>::DoConvertToPathType(DynamicType *type)

{
  bool bVar1;
  TypeId TVar2;
  JavascriptMethod thunk;
  DynamicTypeHandler *this;
  DynamicType *type_local;
  
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01eb5b30,ShareCrossSiteFuncTypesPhase);
  if (bVar1) {
    thunk = Js::Type::GetEntryPoint(&type->super_Type);
    bVar1 = CrossSite::IsThunk(thunk);
    if (bVar1) {
      return false;
    }
  }
  this = DynamicType::GetTypeHandler(type);
  bVar1 = DynamicTypeHandler::GetIsPrototype(this);
  if (bVar1) {
    return false;
  }
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,ShareFuncTypesPhase);
  if ((bVar1) && (TVar2 = Js::Type::GetTypeId(&type->super_Type), TVar2 == TypeIds_Function)) {
    return false;
  }
  return true;
}

Assistant:

bool SimpleTypeHandler<size>::DoConvertToPathType(DynamicType* type)
    {
        if ((PHASE_ON1(ShareCrossSiteFuncTypesPhase) && CrossSite::IsThunk(type->GetEntryPoint())) || type->GetTypeHandler()->GetIsPrototype())
        {
            return false;
        }

        if (PHASE_OFF1(ShareFuncTypesPhase))
        {
            if (type->GetTypeId() == TypeIds_Function)
            {
                return false;
            }
        }

        return true;
    }